

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool PerlinNoise<Blob<256>>
               (hashfunc<Blob<256>_> hash,int inputLen,bool testColl,bool testDist,bool drawDiagram)

{
  bool bVar1;
  bool result;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  bool in_stack_000000cb;
  bool in_stack_000000cc;
  bool in_stack_000000cd;
  bool in_stack_000000ce;
  bool in_stack_000000cf;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_000000d0;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_000000e8;
  pfHash in_stack_000000f0;
  int in_stack_000000f8;
  int in_stack_000000fc;
  int in_stack_00000100;
  int in_stack_00000104;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffffd0;
  hashfunc local_8 [8];
  
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x1a0463);
  hashfunc::operator_cast_to_function_pointer(local_8);
  PerlinNoiseTest<Blob<256>>
            (in_stack_00000104,in_stack_00000100,in_stack_000000fc,in_stack_000000f8,
             in_stack_000000f0,in_stack_000000e8);
  bVar1 = TestHashList<Blob<256>>
                    (in_stack_000000d0,in_stack_000000cf,in_stack_000000ce,in_stack_000000cd,
                     in_stack_000000cc,in_stack_000000cb);
  printf("\n");
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar1;
}

Assistant:

bool PerlinNoise ( hashfunc<hashtype> hash, int inputLen,
                   bool testColl, bool testDist, bool drawDiagram )
{
  //----------

  std::vector<hashtype> hashes;

  PerlinNoiseTest(12, 12, inputLen, 1, hash,hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}